

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall
ImDrawList::AddRectFilledMultiColor
          (ImDrawList *this,ImVec2 *a,ImVec2 *c,ImU32 col_upr_left,ImU32 col_upr_right,
          ImU32 col_bot_right,ImU32 col_bot_left)

{
  ImVec2 local_44;
  ImVec2 local_3c;
  ImVec2 local_34;
  ImVec2 uv;
  ImU32 col_bot_right_local;
  ImU32 col_upr_right_local;
  ImU32 col_upr_left_local;
  ImVec2 *c_local;
  ImVec2 *a_local;
  ImDrawList *this_local;
  
  if ((col_upr_left | col_upr_right | col_bot_right | col_bot_left) >> 0x18 != 0) {
    local_34 = GImGui->FontTexUvWhitePixel;
    uv.x = (float)col_bot_right;
    uv.y = (float)col_upr_right;
    PrimReserve(this,6,4);
    PrimWriteIdx(this,(ImDrawIdx)this->_VtxCurrentIdx);
    PrimWriteIdx(this,(short)this->_VtxCurrentIdx + 1);
    PrimWriteIdx(this,(short)this->_VtxCurrentIdx + 2);
    PrimWriteIdx(this,(ImDrawIdx)this->_VtxCurrentIdx);
    PrimWriteIdx(this,(short)this->_VtxCurrentIdx + 2);
    PrimWriteIdx(this,(short)this->_VtxCurrentIdx + 3);
    PrimWriteVtx(this,a,&local_34,col_upr_left);
    ImVec2::ImVec2(&local_3c,c->x,a->y);
    PrimWriteVtx(this,&local_3c,&local_34,(ImU32)uv.y);
    PrimWriteVtx(this,c,&local_34,(ImU32)uv.x);
    ImVec2::ImVec2(&local_44,a->x,c->y);
    PrimWriteVtx(this,&local_44,&local_34,col_bot_left);
  }
  return;
}

Assistant:

void ImDrawList::AddRectFilledMultiColor(const ImVec2& a, const ImVec2& c, ImU32 col_upr_left, ImU32 col_upr_right, ImU32 col_bot_right, ImU32 col_bot_left)
{
    if (((col_upr_left | col_upr_right | col_bot_right | col_bot_left) >> 24) == 0)
        return;

    const ImVec2 uv = GImGui->FontTexUvWhitePixel;
    PrimReserve(6, 4);
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+1)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2));
    PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+2)); PrimWriteIdx((ImDrawIdx)(_VtxCurrentIdx+3));
    PrimWriteVtx(a, uv, col_upr_left);
    PrimWriteVtx(ImVec2(c.x, a.y), uv, col_upr_right);
    PrimWriteVtx(c, uv, col_bot_right);
    PrimWriteVtx(ImVec2(a.x, c.y), uv, col_bot_left);
}